

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuLaunchFunctsC.H
# Opt level: O0

void amrex::
     ParallelFor<int,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__0,void>
               (Box *box,int ncomp,anon_class_496_12_8bd2d905 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ESI;
  int *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int iVar7;
  int iVar8;
  int local_108;
  int local_104;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  iVar5 = in_RDI[4];
  iVar6 = in_RDI[5];
  for (local_104 = 0; local_108 = iVar3, local_104 < in_ESI; local_104 = local_104 + 1) {
    for (; iVar8 = iVar2, local_108 <= iVar6; local_108 = local_108 + 1) {
      for (; iVar7 = iVar1, iVar8 <= iVar5; iVar8 = iVar8 + 1) {
        for (; iVar7 <= iVar4; iVar7 = iVar7 + 1) {
          detail::
          call_f<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__0,int>
                    ((anon_class_496_12_8bd2d905 *)CONCAT44(iVar8,iVar7),in_stack_fffffffffffffeec,
                     in_stack_fffffffffffffee8,0,0x66e0f4);
        }
      }
    }
  }
  return;
}

Assistant:

void ParallelFor (Box const& box, T ncomp, L&& f) noexcept
{
    const auto lo = amrex::lbound(box);
    const auto hi = amrex::ubound(box);
    for (T n = 0; n < ncomp; ++n) {
        for (int k = lo.z; k <= hi.z; ++k) {
        for (int j = lo.y; j <= hi.y; ++j) {
        AMREX_PRAGMA_SIMD
        for (int i = lo.x; i <= hi.x; ++i) {
            detail::call_f(f,i,j,k,n);
        }}}
    }
}